

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O0

RandNum __thiscall MetaSim::RandomGen::sample(RandomGen *this)

{
  RandNum xr;
  RandNum xq;
  RandomGen *this_local;
  
  this->_xn = (this->_xn % 0x1f31d) * 0x41a7 + (this->_xn / 0x1f31d) * -0xb14;
  if (this->_xn < 0) {
    this->_xn = this->_xn + 0x7fffffff;
  }
  return this->_xn;
}

Assistant:

RandNum RandomGen::sample()
    {
        RandNum xq, xr;

        xq = _xn / Q;
        xr = _xn % Q;

        _xn = A * xr - R * xq;
        if (_xn < 0) _xn += M;

        return _xn;
    }